

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

BOOL RemoveDirectoryA(LPCSTR lpPathName)

{
  BOOL BVar1;
  errno_t eVar2;
  size_t count;
  char *_Dst;
  long in_FS_OFFSET;
  char *mb_dir;
  size_t length;
  BOOL bRet;
  DWORD dwLastError;
  LPCSTR lpPathName_local;
  PathCharString mb_dirPathString;
  
  mb_dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  length._4_4_ = 0;
  length._0_4_ = 0;
  _bRet = lpPathName;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPathName_local);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (_bRet == (char *)0x0) {
    length._4_4_ = 3;
  }
  else {
    count = strlen(_bRet);
    _Dst = StackString<32UL,_char>::OpenStringBuffer
                     ((StackString<32UL,_char> *)&lpPathName_local,count);
    if (_Dst == (char *)0x0) {
      length._4_4_ = 8;
    }
    else {
      eVar2 = strncpy_s(_Dst,count + 1,_bRet,0x400);
      if (eVar2 == 0) {
        StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpPathName_local,count);
        length._0_4_ = RemoveDirectoryHelper(_Dst,(LPDWORD)((long)&length + 4));
      }
      else {
        StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpPathName_local,count);
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        length._4_4_ = 0xce;
      }
    }
  }
  if (length._4_4_ != 0) {
    SetLastError(length._4_4_);
  }
  BVar1 = (BOOL)length;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPathName_local);
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == mb_dirPathString.m_count) {
    return BVar1;
  }
  __stack_chk_fail();
}

Assistant:

BOOL
PALAPI
RemoveDirectoryA(
         IN LPCSTR lpPathName)
{
    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;
    PathCharString mb_dirPathString;
    size_t length;
    char * mb_dir;
    
    PERF_ENTRY(RemoveDirectoryA);
    ENTRY("RemoveDirectoryA(lpPathName=%p (%s))\n",
          lpPathName,
          lpPathName);

    if (lpPathName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    length = strlen(lpPathName);
    mb_dir = mb_dirPathString.OpenStringBuffer(length);
    if (NULL == mb_dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    
    if (strncpy_s (mb_dir, sizeof(char) * (length+1), lpPathName, MAX_LONGPATH) != SAFECRT_SUCCESS)
    {
        mb_dirPathString.CloseBuffer(length);
        WARN("mb_dir is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    mb_dirPathString.CloseBuffer(length);
    bRet = RemoveDirectoryHelper (mb_dir, &dwLastError);

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }

    LOGEXIT("RemoveDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(RemoveDirectoryA);
    return bRet;
}